

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UnicodeString::toUTF8
          (UnicodeString *this,int32_t start,int32_t len,char *target,int32_t capacity)

{
  ushort uVar1;
  char16_t *pcVar2;
  int iVar3;
  int srcLength;
  int32_t iVar4;
  UErrorCode errorCode;
  int32_t length8;
  
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  errorCode = U_ZERO_ERROR;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar2 = (this->fUnion).fFields.fArray;
    }
    else {
      pcVar2 = (char16_t *)((long)&this->fUnion + 2);
    }
  }
  else {
    pcVar2 = (char16_t *)0x0;
  }
  iVar3 = (int)(short)uVar1 >> 5;
  if ((short)uVar1 < 0) {
    iVar3 = (this->fUnion).fFields.fLength;
  }
  iVar4 = start;
  if (iVar3 < start) {
    iVar4 = iVar3;
  }
  if (start < 0) {
    iVar4 = 0;
  }
  srcLength = iVar3 - iVar4;
  if (len <= iVar3 - iVar4) {
    srcLength = len;
  }
  if (len < 0) {
    srcLength = 0;
  }
  u_strToUTF8WithSub_63
            (target,capacity,&length8,pcVar2 + iVar4,srcLength,0xfffd,(int32_t *)0x0,&errorCode);
  return length8;
}

Assistant:

int32_t
UnicodeString::toUTF8(int32_t start, int32_t len,
                      char *target, int32_t capacity) const {
  pinIndices(start, len);
  int32_t length8;
  UErrorCode errorCode = U_ZERO_ERROR;
  u_strToUTF8WithSub(target, capacity, &length8,
                     getBuffer() + start, len,
                     0xFFFD,  // Standard substitution character.
                     NULL,    // Don't care about number of substitutions.
                     &errorCode);
  return length8;
}